

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O0

int write_s98v3_tags(s98c *ctx,FILE *fp)

{
  s98taginfo *info;
  int i;
  FILE *fp_local;
  s98c *ctx_local;
  
  if (ctx->source_encoding == (char *)0x0) {
    if (ctx->tags_count == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      fprintf((FILE *)fp,"[S98]");
      for (info._4_4_ = 0; (ulong)(long)info._4_4_ < ctx->tags_count; info._4_4_ = info._4_4_ + 1) {
        fprintf((FILE *)fp,"%s=%s\n",ctx->tags[info._4_4_].key,ctx->tags[info._4_4_].value);
      }
      fputc(0,(FILE *)fp);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = write_s98v3_tags_utf8(ctx,fp);
  }
  return ctx_local._4_4_;
}

Assistant:

int write_s98v3_tags(struct s98c* ctx, FILE* fp)
{
    int i;

#ifdef HAVE_ICONV
    if(ctx->source_encoding != NULL) return write_s98v3_tags_utf8(ctx, fp);
#endif

    if(ctx->tags_count == 0) return 0;

    fprintf(fp, "[S98]");
    for(i = 0; i < ctx->tags_count; i++) {
        struct s98taginfo* info = ctx->tags + i;
        fprintf(fp, "%s=%s\x0a", info->key, info->value);
    }
    fputc(0, fp);

    return 0;
}